

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLsSetup(KINMem kin_mem)

{
  void *pvVar1;
  int iVar2;
  undefined4 uVar3;
  KINMem in_RDI;
  int retval;
  KINLsMem kinls_mem;
  
  if (in_RDI->kin_lmem == (void *)0x0) {
    KINProcessError(in_RDI,-2,0x483,"kinLsSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                    ,"Linear solver memory is NULL.");
    return -2;
  }
  pvVar1 = in_RDI->kin_lmem;
  if (*(long *)((long)pvVar1 + 0x28) != 0) {
    *(long *)((long)pvVar1 + 0x38) = *(long *)((long)pvVar1 + 0x38) + 1;
    iVar2 = SUNLinSolGetType(*(undefined8 *)((long)pvVar1 + 0x20));
    if ((iVar2 == 0) && (iVar2 = SUNMatZero(*(undefined8 *)((long)pvVar1 + 0x28)), iVar2 != 0)) {
      KINProcessError(in_RDI,-7,0x495,"kinLsSetup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"The SUNMatZero routine failed in an unrecoverable manner.");
      *(undefined4 *)((long)pvVar1 + 0x74) = 0xfffffff9;
      return *(int *)((long)pvVar1 + 0x74);
    }
    iVar2 = (**(code **)((long)pvVar1 + 0x10))
                      (in_RDI->kin_uu,in_RDI->kin_fval,*(undefined8 *)((long)pvVar1 + 0x28),
                       *(undefined8 *)((long)pvVar1 + 0x18),in_RDI->kin_vtemp1,in_RDI->kin_vtemp2);
    if (iVar2 != 0) {
      KINProcessError(in_RDI,-6,0x4a2,"kinLsSetup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"The Jacobian routine failed in an unrecoverable manner.");
      *(undefined4 *)((long)pvVar1 + 0x74) = 0xfffffffa;
      return *(int *)((long)pvVar1 + 0x74);
    }
  }
  uVar3 = SUNLinSolSetup(*(undefined8 *)((long)pvVar1 + 0x20),*(undefined8 *)((long)pvVar1 + 0x28));
  *(undefined4 *)((long)pvVar1 + 0x74) = uVar3;
  in_RDI->kin_nnilset = in_RDI->kin_nni;
  return *(int *)((long)pvVar1 + 0x74);
}

Assistant:

int kinLsSetup(KINMem kin_mem)
{
  KINLsMem kinls_mem;
  int retval;

  /* Access KINLsMem structure */
  if (kin_mem->kin_lmem == NULL)
  {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  /* recompute if J if it is non-NULL */
  if (kinls_mem->J)
  {
    /* Increment nje counter. */
    kinls_mem->nje++;

    /* Clear the linear system matrix if necessary */
    if (SUNLinSolGetType(kinls_mem->LS) == SUNLINEARSOLVER_DIRECT)
    {
      retval = SUNMatZero(kinls_mem->J);
      if (retval != 0)
      {
        KINProcessError(kin_mem, KINLS_SUNMAT_FAIL, __LINE__, __func__,
                        __FILE__, MSG_LS_MATZERO_FAILED);
        kinls_mem->last_flag = KINLS_SUNMAT_FAIL;
        return (kinls_mem->last_flag);
      }
    }

    /* Call Jacobian routine */
    retval = kinls_mem->jac(kin_mem->kin_uu, kin_mem->kin_fval, kinls_mem->J,
                            kinls_mem->J_data, kin_mem->kin_vtemp1,
                            kin_mem->kin_vtemp2);
    if (retval != 0)
    {
      KINProcessError(kin_mem, KINLS_JACFUNC_ERR, __LINE__, __func__, __FILE__,
                      MSG_LS_JACFUNC_FAILED);
      kinls_mem->last_flag = KINLS_JACFUNC_ERR;
      return (kinls_mem->last_flag);
    }
  }

  /* Call LS setup routine -- the LS will call kinLsPSetup (if applicable) */
  kinls_mem->last_flag = SUNLinSolSetup(kinls_mem->LS, kinls_mem->J);

  /* save nni value from most recent lsetup call */
  kin_mem->kin_nnilset = kin_mem->kin_nni;

  return (kinls_mem->last_flag);
}